

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O0

void PatchRandoWorldEdits::put_back_golems_in_lake_shrine_keydoor_map(World *world)

{
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *pvVar1;
  Entity *this;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> *this_00;
  EntityMaskFlag local_28;
  Map *local_18;
  Map *map;
  World *world_local;
  
  map = (Map *)world;
  local_18 = World::map(world,0x132);
  pvVar1 = Map::global_entity_mask_flags(local_18);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear(pvVar1);
  pvVar1 = Map::key_door_mask_flags(local_18);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear(pvVar1);
  this = Map::entity(local_18,'\x04');
  this_00 = Entity::mask_flags(this);
  EntityMaskFlag::EntityMaskFlag(&local_28,false,'\a','\x05');
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
            (this_00,&local_28);
  return;
}

Assistant:

static void put_back_golems_in_lake_shrine_keydoor_map(World& world)
    {
        Map* map = world.map(MAP_LAKE_SHRINE_0F_KEYDOOR);
        map->global_entity_mask_flags().clear();
        map->key_door_mask_flags().clear();
        map->entity(4)->mask_flags().emplace_back(EntityMaskFlag(false, 7, 5));
    }